

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int evp_keyex_create(ptls_key_exchange_algorithm_t *algo,ptls_key_exchange_context_t **ctx)

{
  int iVar1;
  EVP_PKEY_CTX *ctx_00;
  EVP_PKEY *pkey;
  EVP_PKEY *local_30;
  
  local_30 = (EVP_PKEY *)0x0;
  ctx_00 = EVP_PKEY_CTX_new_id((int)algo->data,(ENGINE *)0x0);
  if (ctx_00 == (EVP_PKEY_CTX *)0x0) {
    return 0x203;
  }
  iVar1 = EVP_PKEY_keygen_init(ctx_00);
  if (iVar1 < 1) {
    iVar1 = 0x203;
  }
  else {
    iVar1 = EVP_PKEY_keygen(ctx_00,&local_30);
    if (iVar1 < 1) {
      iVar1 = 0x203;
    }
    else {
      iVar1 = evp_keyex_init(algo,ctx,(EVP_PKEY *)local_30);
      if (iVar1 == 0) {
        local_30 = (EVP_PKEY *)0x0;
        iVar1 = 0;
        goto LAB_001235fd;
      }
    }
    if (local_30 != (EVP_PKEY *)0x0) {
      EVP_PKEY_free(local_30);
    }
  }
LAB_001235fd:
  EVP_PKEY_CTX_free(ctx_00);
  return iVar1;
}

Assistant:

static int evp_keyex_create(ptls_key_exchange_algorithm_t *algo, ptls_key_exchange_context_t **ctx)
{
    EVP_PKEY_CTX *evpctx = NULL;
    EVP_PKEY *pkey = NULL;
    int ret;

    /* generate private key */
    if ((evpctx = EVP_PKEY_CTX_new_id((int)algo->data, NULL)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_keygen_init(evpctx) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_keygen(evpctx, &pkey) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    /* setup */
    if ((ret = evp_keyex_init(algo, ctx, pkey)) != 0)
        goto Exit;
    pkey = NULL;
    ret = 0;

Exit:
    if (pkey != NULL)
        EVP_PKEY_free(pkey);
    if (evpctx != NULL)
        EVP_PKEY_CTX_free(evpctx);
    return ret;
}